

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O3

Vector3D * __thiscall
CMU462::UniformHemisphereSampler3D::get_sample
          (Vector3D *__return_storage_ptr__,UniformHemisphereSampler3D *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  iVar3 = rand();
  iVar4 = rand();
  dVar1 = acos((double)iVar3 / 2147483647.0);
  fVar9 = ((float)iVar4 / 2.1474836e+09) * 6.2831855;
  fVar5 = (float)dVar1;
  fVar6 = sinf(fVar5);
  fVar7 = cosf(fVar9);
  fVar8 = sinf(fVar5);
  fVar9 = sinf(fVar9);
  fVar5 = cosf(fVar5);
  auVar2._8_4_ = SUB84((double)(fVar9 * fVar8),0);
  auVar2._0_8_ = (double)(fVar7 * fVar6);
  auVar2._12_4_ = (int)((ulong)(double)(fVar9 * fVar8) >> 0x20);
  __return_storage_ptr__->x = (double)(fVar7 * fVar6);
  __return_storage_ptr__->y = (double)auVar2._8_8_;
  __return_storage_ptr__->z = (double)fVar5;
  return __return_storage_ptr__;
}

Assistant:

Vector3D UniformHemisphereSampler3D::get_sample() const {

    double Xi1 = (double)(std::rand()) / RAND_MAX;
    double Xi2 = (double)(std::rand()) / RAND_MAX;

    double theta = acos(Xi1);
    double phi = 2.0 * PI * Xi2;

    double xs = sinf(theta) * cosf(phi);
    double ys = sinf(theta) * sinf(phi);
    double zs = cosf(theta);

    return Vector3D(xs, ys, zs);

  }